

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t argumentNode,
          sysbvm_tuple_t *activationEnvironment)

{
  undefined1 local_68 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_26fdac2c gcFrame;
  sysbvm_tuple_t *activationEnvironment_local;
  sysbvm_tuple_t argumentNode_local;
  sysbvm_context_t *context_local;
  
  gcFrame.argumentNode = (sysbvm_astArgumentNode_t *)0x0;
  gcFrameRecord.roots = (sysbvm_tuple_t *)argumentNode;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  local_68 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  if (gcFrameRecord.roots[7] != 0) {
    gcFrame.argumentNode =
         (sysbvm_astArgumentNode_t *)
         sysbvm_interpreter_evaluateASTWithEnvironment
                   (context,gcFrameRecord.roots[7],*activationEnvironment);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrame.argumentNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_evaluateArgumentNodeTypeInEnvironment(sysbvm_context_t *context, sysbvm_tuple_t argumentNode, sysbvm_tuple_t *activationEnvironment)
{
    struct {
        sysbvm_astArgumentNode_t *argumentNode;
        sysbvm_tuple_t expectedType;
    } gcFrame = {
        .argumentNode = (sysbvm_astArgumentNode_t*)argumentNode,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.argumentNode->super.sourcePosition);

    if(gcFrame.argumentNode->type)
        gcFrame.expectedType = sysbvm_interpreter_evaluateASTWithEnvironment(context, gcFrame.argumentNode->type, *activationEnvironment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.expectedType;
}